

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

void normalizeFloat128Subnormal
               (uint64_t aSig0,uint64_t aSig1,int32_t *zExpPtr,uint64_t *zSig0Ptr,uint64_t *zSig1Ptr
               )

{
  long lVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  byte bVar4;
  int iVar5;
  
  if (aSig0 == 0) {
    if (aSig1 == 0) {
      bVar4 = 0x40;
    }
    else {
      lVar1 = 0x3f;
      if (aSig1 != 0) {
        for (; aSig1 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      bVar4 = (byte)lVar1 ^ 0x3f;
    }
    bVar4 = bVar4 - 0xf;
    if ((char)bVar4 < '\0') {
      uVar2 = aSig1 >> (-bVar4 & 0x3f);
      uVar3 = aSig1 << (bVar4 & 0x3f);
    }
    else {
      uVar2 = aSig1 << (bVar4 & 0x3f);
      uVar3 = 0;
    }
    *zSig0Ptr = uVar2;
    *zSig1Ptr = uVar3;
    iVar5 = -0x3f - (char)bVar4;
  }
  else {
    lVar1 = 0x3f;
    if (aSig0 != 0) {
      for (; aSig0 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    iVar5 = ((uint)lVar1 ^ 0x3f) * 0x1000000 + -0xf000000;
    bVar4 = (byte)((uint)iVar5 >> 0x18);
    *zSig1Ptr = aSig1 << (bVar4 & 0x3f);
    if (iVar5 != 0) {
      aSig0 = aSig0 << (bVar4 & 0x3f) | aSig1 >> (-bVar4 & 0x3f);
    }
    *zSig0Ptr = aSig0;
    iVar5 = 1 - (iVar5 >> 0x18);
  }
  *zExpPtr = iVar5;
  return;
}

Assistant:

static void
 normalizeFloat128Subnormal(
     uint64_t aSig0,
     uint64_t aSig1,
     int32_t *zExpPtr,
     uint64_t *zSig0Ptr,
     uint64_t *zSig1Ptr
 )
{
    int8_t shiftCount;

    if ( aSig0 == 0 ) {
        shiftCount = clz64(aSig1) - 15;
        if ( shiftCount < 0 ) {
            *zSig0Ptr = aSig1>>( - shiftCount );
            *zSig1Ptr = aSig1<<( shiftCount & 63 );
        }
        else {
            *zSig0Ptr = aSig1<<shiftCount;
            *zSig1Ptr = 0;
        }
        *zExpPtr = - shiftCount - 63;
    }
    else {
        shiftCount = clz64(aSig0) - 15;
        shortShift128Left( aSig0, aSig1, shiftCount, zSig0Ptr, zSig1Ptr );
        *zExpPtr = 1 - shiftCount;
    }

}